

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.c
# Opt level: O3

void lws_header_table_reset(lws *wsi,int autoservice)

{
  short *psVar1;
  pollfd *pollfd;
  allocated_headers *paVar2;
  size_t sVar3;
  
  paVar2 = (wsi->http).ah;
  if (paVar2 == (allocated_headers *)0x0) {
    __assert_fail("ah",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/roles/http/parsers.c"
                  ,0x74,"void __lws_header_table_reset(struct lws *, int)");
  }
  if (paVar2->wsi == wsi) {
    paVar2->frag_index[0x4f] = '\0';
    paVar2->frag_index[0x50] = '\0';
    paVar2->frag_index[0x51] = '\0';
    paVar2->frag_index[0x52] = '\0';
    paVar2->frag_index[0x53] = '\0';
    paVar2->frag_index[0x54] = '\0';
    paVar2->frag_index[0x55] = '\0';
    paVar2->frag_index[0x56] = '\0';
    paVar2->frag_index[0x57] = '\0';
    paVar2->frag_index[0x58] = '\0';
    paVar2->frag_index[0x59] = '\0';
    paVar2->frag_index[0x5a] = '\0';
    paVar2->frag_index[0x5b] = '\0';
    paVar2->frag_index[0x5c] = '\0';
    paVar2->frag_index[0x5d] = '\0';
    paVar2->frag_index[0x5e] = '\0';
    paVar2->frag_index[0x40] = '\0';
    paVar2->frag_index[0x41] = '\0';
    paVar2->frag_index[0x42] = '\0';
    paVar2->frag_index[0x43] = '\0';
    paVar2->frag_index[0x44] = '\0';
    paVar2->frag_index[0x45] = '\0';
    paVar2->frag_index[0x46] = '\0';
    paVar2->frag_index[0x47] = '\0';
    paVar2->frag_index[0x48] = '\0';
    paVar2->frag_index[0x49] = '\0';
    paVar2->frag_index[0x4a] = '\0';
    paVar2->frag_index[0x4b] = '\0';
    paVar2->frag_index[0x4c] = '\0';
    paVar2->frag_index[0x4d] = '\0';
    paVar2->frag_index[0x4e] = '\0';
    paVar2->frag_index[0x4f] = '\0';
    paVar2->frag_index[0x30] = '\0';
    paVar2->frag_index[0x31] = '\0';
    paVar2->frag_index[0x32] = '\0';
    paVar2->frag_index[0x33] = '\0';
    paVar2->frag_index[0x34] = '\0';
    paVar2->frag_index[0x35] = '\0';
    paVar2->frag_index[0x36] = '\0';
    paVar2->frag_index[0x37] = '\0';
    paVar2->frag_index[0x38] = '\0';
    paVar2->frag_index[0x39] = '\0';
    paVar2->frag_index[0x3a] = '\0';
    paVar2->frag_index[0x3b] = '\0';
    paVar2->frag_index[0x3c] = '\0';
    paVar2->frag_index[0x3d] = '\0';
    paVar2->frag_index[0x3e] = '\0';
    paVar2->frag_index[0x3f] = '\0';
    paVar2->frag_index[0x20] = '\0';
    paVar2->frag_index[0x21] = '\0';
    paVar2->frag_index[0x22] = '\0';
    paVar2->frag_index[0x23] = '\0';
    paVar2->frag_index[0x24] = '\0';
    paVar2->frag_index[0x25] = '\0';
    paVar2->frag_index[0x26] = '\0';
    paVar2->frag_index[0x27] = '\0';
    paVar2->frag_index[0x28] = '\0';
    paVar2->frag_index[0x29] = '\0';
    paVar2->frag_index[0x2a] = '\0';
    paVar2->frag_index[0x2b] = '\0';
    paVar2->frag_index[0x2c] = '\0';
    paVar2->frag_index[0x2d] = '\0';
    paVar2->frag_index[0x2e] = '\0';
    paVar2->frag_index[0x2f] = '\0';
    paVar2->frag_index[0x10] = '\0';
    paVar2->frag_index[0x11] = '\0';
    paVar2->frag_index[0x12] = '\0';
    paVar2->frag_index[0x13] = '\0';
    paVar2->frag_index[0x14] = '\0';
    paVar2->frag_index[0x15] = '\0';
    paVar2->frag_index[0x16] = '\0';
    paVar2->frag_index[0x17] = '\0';
    paVar2->frag_index[0x18] = '\0';
    paVar2->frag_index[0x19] = '\0';
    paVar2->frag_index[0x1a] = '\0';
    paVar2->frag_index[0x1b] = '\0';
    paVar2->frag_index[0x1c] = '\0';
    paVar2->frag_index[0x1d] = '\0';
    paVar2->frag_index[0x1e] = '\0';
    paVar2->frag_index[0x1f] = '\0';
    paVar2->frag_index[0] = '\0';
    paVar2->frag_index[1] = '\0';
    paVar2->frag_index[2] = '\0';
    paVar2->frag_index[3] = '\0';
    paVar2->frag_index[4] = '\0';
    paVar2->frag_index[5] = '\0';
    paVar2->frag_index[6] = '\0';
    paVar2->frag_index[7] = '\0';
    paVar2->frag_index[8] = '\0';
    paVar2->frag_index[9] = '\0';
    paVar2->frag_index[10] = '\0';
    paVar2->frag_index[0xb] = '\0';
    paVar2->frag_index[0xc] = '\0';
    paVar2->frag_index[0xd] = '\0';
    paVar2->frag_index[0xe] = '\0';
    paVar2->frag_index[0xf] = '\0';
    memset(paVar2->frags,0,0x2f8);
    paVar2->nfrag = '\0';
    paVar2->pos = 0;
    paVar2->http_response = 0;
    paVar2->parser_state = '`';
    paVar2->lextable_pos = 0;
    paVar2->unk_pos = 0;
    paVar2->unk_ll_head = 0;
    paVar2->unk_ll_tail = 0;
    wsi->field_0x2dc = wsi->field_0x2dc & 0xfe;
    __lws_set_timeout(wsi,PENDING_TIMEOUT_HOLDING_AH,wsi->vhost->timeout_secs_ah_idle);
    time(&paVar2->assigned);
    if (wsi->position_in_fds_table != -1) {
      sVar3 = lws_buflist_next_segment_len(&wsi->buflist,(uint8_t **)0x0);
      if ((autoservice != 0) && (sVar3 != 0)) {
        _lws_log(0x10,"%s: service on readbuf ah\n","__lws_header_table_reset");
        pollfd = wsi->context->pt[wsi->tsi].fds + wsi->position_in_fds_table;
        psVar1 = &pollfd->revents;
        *psVar1 = *psVar1 | 1;
        _lws_log(1,"%s: calling service\n","__lws_header_table_reset");
        lws_service_fd_tsi(wsi->context,pollfd,(int)wsi->tsi);
        return;
      }
    }
    return;
  }
  __assert_fail("ah->wsi == wsi",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/roles/http/parsers.c"
                ,0x76,"void __lws_header_table_reset(struct lws *, int)");
}

Assistant:

void
_lws_header_table_reset(struct allocated_headers *ah)
{
	/* init the ah to reflect no headers or data have appeared yet */
	memset(ah->frag_index, 0, sizeof(ah->frag_index));
	memset(ah->frags, 0, sizeof(ah->frags));
	ah->nfrag = 0;
	ah->pos = 0;
	ah->http_response = 0;
	ah->parser_state = WSI_TOKEN_NAME_PART;
	ah->lextable_pos = 0;
#if defined(LWS_WITH_CUSTOM_HEADERS)
	ah->unk_pos = 0;
	ah->unk_ll_head = 0;
	ah->unk_ll_tail = 0;
#endif
}